

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

string * __thiscall
gl3cts::TextureSwizzle::FunctionalTest::prepareValues_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest *this,size_t format_idx)

{
  ostream *poVar1;
  double ch_rgba [4];
  stringstream stream;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  stringstream local_198 [128];
  ios_base local_118 [264];
  
  local_1a8 = 0.0;
  dStack_1a0 = 0.0;
  local_1b8 = 0.0;
  dStack_1b0 = 0.0;
  calculate_values_from_source(format_idx,&local_1b8);
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::ostream::_M_insert<double>(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(dStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::ostream::_M_insert<double>(dStack_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest::prepareValues(size_t format_idx)
{
	double ch_rgba[4] = { 0.0, 0.0, 0.0, 0.0 };

	calculate_values_from_source(format_idx, ch_rgba);

	/* Prepare string */
	std::stringstream stream;
	stream << ch_rgba[0] << ", " << ch_rgba[1] << ", " << ch_rgba[2] << ", " << ch_rgba[3];

	return stream.str();
}